

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_355c8::entryAndExitPoints1(void)

{
  ostream *this;
  size_t i;
  Box3f *in_stack_000000e0;
  Box3f boxes [15];
  Vec3<float> *in_stack_fffffffffffffce0;
  Box<Imath_3_2::Vec3<float>_> *this_00;
  Vec3<float> *in_stack_fffffffffffffce8;
  Vec3<float> *minT;
  Box<Imath_3_2::Vec3<float>_> *in_stack_fffffffffffffcf0;
  Box<Imath_3_2::Vec3<float>_> *this_01;
  ulong local_2c0;
  Vec3<float> local_2b8;
  Vec3<float> local_2ac;
  Vec3<float> local_2a0;
  Vec3<float> local_294;
  Vec3<float> local_288;
  Vec3<float> local_27c;
  Vec3<float> local_270;
  Vec3<float> local_264;
  Vec3<float> local_258;
  Vec3<float> local_24c;
  Vec3<float> local_240;
  Vec3<float> local_234;
  Vec3<float> local_228;
  Vec3<float> local_21c;
  Vec3<float> local_210;
  Vec3<float> local_204;
  Vec3<float> local_1f8;
  Vec3<float> local_1ec;
  Vec3<float> local_1e0;
  Vec3<float> local_1d4;
  Vec3<float> local_1c8;
  Vec3<float> local_1bc;
  Vec3<float> local_1b0;
  Vec3<float> local_1a4;
  Vec3<float> local_198;
  Vec3<float> local_18c;
  Vec3<float> local_180;
  Vec3<float> local_174 [5];
  Box<Imath_3_2::Vec3<float>_> BStack_138;
  Vec3<float> aVStack_120 [2];
  Box<Imath_3_2::Vec3<float>_> aBStack_108 [11];
  
  this = std::operator<<((ostream *)&std::cout,"  ray-box entry and exit, random rays");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_174,-1.0,-1.0,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_180,1.0,1.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  Imath_3_2::Vec3<float>::Vec3(&local_18c,10.0,20.0,30.0);
  Imath_3_2::Vec3<float>::Vec3(&local_198,1010.0,21.0,31.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  this_00 = &BStack_138;
  Imath_3_2::Vec3<float>::Vec3(&local_1a4,10.0,20.0,30.0);
  Imath_3_2::Vec3<float>::Vec3(&local_1b0,11.0,1020.0,31.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,&this_00->min);
  minT = aVStack_120;
  Imath_3_2::Vec3<float>::Vec3(&local_1bc,10.0,20.0,30.0);
  Imath_3_2::Vec3<float>::Vec3(&local_1c8,11.0,21.0,1030.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(in_stack_fffffffffffffcf0,minT,&this_00->min);
  this_01 = aBStack_108;
  Imath_3_2::Vec3<float>::Vec3(&local_1d4,-1e+10,-2e+10,-3e+10);
  Imath_3_2::Vec3<float>::Vec3(&local_1e0,5e+15,6e+15,7e+15);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_1ec,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_1f8,2.0,1.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_204,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_210,1.0,2.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_21c,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_228,1.0,1.0,2.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_234,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_240,1.0,2.0,3.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_24c,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_258,2.0,3.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_264,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_270,2.0,1.0,3.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_27c,-1.0,-2.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_288,-1.0,-2.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_294,1.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_2a0,1.0,1.0,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Vec3<float>::Vec3(&local_2ac,0.0,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_2b8,0.0,0.0,0.0);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_01,minT,&this_00->min);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box(this_00);
  for (local_2c0 = 0; local_2c0 < 0xf; local_2c0 = local_2c0 + 1) {
    testEntryAndExitPoints(in_stack_000000e0);
  }
  return;
}

Assistant:

void
entryAndExitPoints1 ()
{
    cout << "  ray-box entry and exit, random rays" << endl;

    Box3f boxes[] = {
        // Boxes with a positive volume

        Box3f (V3f (-1, -1, -1), V3f (1, 1, 1)),
        Box3f (V3f (10, 20, 30), V3f (1010, 21, 31)),
        Box3f (V3f (10, 20, 30), V3f (11, 1020, 31)),
        Box3f (V3f (10, 20, 30), V3f (11, 21, 1030)),
        Box3f (V3f (-1e10f, -2e10f, -3e10f), V3f (5e15f, 6e15f, 7e15f)),

        // Non-empty, zero-volume boxes

        Box3f (V3f (1, 1, 1), V3f (2, 1, 1)),
        Box3f (V3f (1, 1, 1), V3f (1, 2, 1)),
        Box3f (V3f (1, 1, 1), V3f (1, 1, 2)),
        Box3f (V3f (1, 1, 1), V3f (1, 2, 3)),
        Box3f (V3f (1, 1, 1), V3f (2, 3, 1)),
        Box3f (V3f (1, 1, 1), V3f (2, 1, 3)),
        Box3f (V3f (-1, -2, 1), V3f (-1, -2, 1)),
        Box3f (V3f (1, 1, 1), V3f (1, 1, 1)),
        Box3f (V3f (0, 0, 0), V3f (0, 0, 0)),

        // empty box

        Box3f ()};

    for (size_t i = 0; i < sizeof (boxes) / sizeof (boxes[0]); ++i)
        testEntryAndExitPoints (boxes[i]);
}